

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# List.hpp
# Opt level: O0

void __thiscall List<Callback::Emitter::Slot>::clear(List<Callback::Emitter::Slot> *this)

{
  Item *end;
  Item *i;
  List<Callback::Emitter::Slot> *this_local;
  
  for (end = (this->_begin).item; end != &this->endItem; end = end->next) {
    end->prev = this->freeItem;
    this->freeItem = end;
  }
  (this->_begin).item = &this->endItem;
  (this->endItem).prev = (Item *)0x0;
  this->_size = 0;
  return;
}

Assistant:

void clear()
  {
    for(Item* i = _begin.item, * end = &endItem; i != end; i = i->next)
    {
      i->~Item();
      i->prev = freeItem;
      freeItem = i;
    }
    _begin.item = &endItem;
    endItem.prev = 0;
    _size = 0;
  }